

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

void __thiscall IR::Instr::DumpByteCodeOffset(Instr *this)

{
  char16 *pcVar1;
  JITTimeFunctionBody *this_00;
  wchar local_68 [4];
  char16 debugStringBuffer [42];
  
  if (this->m_func->topFunc->hasInstrNumber == false) {
    Output::SkipToColumn(0x4e);
    Output::Print(L"#");
    if (this->m_number != 0xffffffff) {
      Output::Print(L"%04x");
      pcVar1 = L"*";
      if ((this->field_0x38 & 8) == 0) {
        pcVar1 = L" ";
      }
      Output::Print(pcVar1);
    }
  }
  if (this->m_func->parentFunc != (Func *)0x0) {
    Output::SkipToColumn(0x4e);
    pcVar1 = Func::GetDebugNumberSet(this->m_func,(wchar (*) [42])local_68);
    Output::Print(L" Func #%s",pcVar1);
  }
  if (this->bailOutByteCodeLocation != 0xffffffff) {
    Output::SkipToColumn(0x55);
    Output::Print(L"@%4d",(ulong)this->bailOutByteCodeLocation);
  }
  if (this->m_opcode == InlineeStart) {
    this_00 = Func::GetJITFunctionBody(this->m_func);
    pcVar1 = JITTimeFunctionBody::GetDisplayName(this_00);
    Output::Print(L" %s",pcVar1);
  }
  return;
}

Assistant:

void
Instr::DumpByteCodeOffset()
{
    if (m_func->HasByteCodeOffset())
    {
        Output::SkipToColumn(78);
        Output::Print(_u("#"));
        if (this->m_number != Js::Constants::NoByteCodeOffset)
        {
            Output::Print(_u("%04x"), this->m_number);
            Output::Print(this->IsCloned()? _u("*") : _u(" "));
        }
    }
    if (!this->m_func->IsTopFunc())
    {
        Output::SkipToColumn(78);
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(_u(" Func #%s"), this->m_func->GetDebugNumberSet(debugStringBuffer));
    }
#ifdef BAILOUT_INJECTION
    if (this->bailOutByteCodeLocation != (uint)-1)
    {
        Output::SkipToColumn(85);
        Output::Print(_u("@%4d"), this->bailOutByteCodeLocation);
    }
#endif
    if (this->m_opcode == Js::OpCode::InlineeStart)
    {
        Output::Print(_u(" %s"), this->m_func->GetJITFunctionBody()->GetDisplayName());
    }
}